

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall
mkvmuxer::ContentEncoding::EncodingSize
          (ContentEncoding *this,uint64_t compression_size,uint64_t encryption_size)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  long in_RDX;
  long in_RSI;
  uint64 in_RDI;
  uint64_t encoding_size;
  uint64 in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_28 = 0;
    if (in_RDX != 0) {
      uVar1 = EbmlMasterElementSize(in_RDI,in_stack_ffffffffffffffc8);
      local_28 = uVar1 + in_RDX;
    }
    uVar1 = EbmlElementSize(in_RDI,in_stack_ffffffffffffffc8);
    uVar2 = EbmlElementSize(in_RDI,in_stack_ffffffffffffffc8);
    uVar3 = EbmlElementSize(in_RDI,in_stack_ffffffffffffffc8);
    local_8 = uVar3 + uVar2 + uVar1 + local_28;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t ContentEncoding::EncodingSize(uint64_t compression_size,
                                       uint64_t encryption_size) const {
  // TODO(fgalligan): Add support for compression settings.
  if (compression_size != 0)
    return 0;

  uint64_t encoding_size = 0;

  if (encryption_size > 0) {
    encoding_size +=
        EbmlMasterElementSize(libwebm::kMkvContentEncryption, encryption_size) +
        encryption_size;
  }
  encoding_size += EbmlElementSize(libwebm::kMkvContentEncodingType,
                                   static_cast<uint64>(encoding_type_));
  encoding_size += EbmlElementSize(libwebm::kMkvContentEncodingScope,
                                   static_cast<uint64>(encoding_scope_));
  encoding_size += EbmlElementSize(libwebm::kMkvContentEncodingOrder,
                                   static_cast<uint64>(encoding_order_));

  return encoding_size;
}